

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::PartitionGraph::
PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (PartitionGraph *this,Data *data,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *edgeLabels)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  ProblemGraph *pPVar4;
  pointer pEVar5;
  long lVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  _Bvector_impl *p_Var9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  size_t edge;
  ulong uVar13;
  long lVar14;
  _Bit_iterator __first;
  _Bit_iterator __last;
  ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
  components;
  SubgraphWithCut local_40;
  
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).multipleEdgesEnabled_ =
       false;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  this->data_ = data;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.problemGraph_ = data->problemGraph;
  local_40.labels_ = edgeLabels;
  sVar10 = andres::graph::
           ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>const&>
           ::
           build<lineage::heuristics::PartitionGraph::PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>(lineage::Data&,std::vector<unsigned_char,std::allocator<unsigned_char>>&)::SubgraphWithCut>
                     ((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>const&>
                       *)&components,&(local_40.problemGraph_)->graph_,&local_40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->vertexLabels_,&components.labels_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&components);
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->partitions_,sVar10);
  for (components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start = (pointer)0x0;
      puVar3 = (this->vertexLabels_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
      components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start <
      (pointer)((long)(this->vertexLabels_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
      components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)components.labels_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1)) {
    std::__detail::
    _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)((this->partitions_).
                 super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                puVar3[(long)components.labels_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start]),(value_type *)&components);
  }
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertVertices
            (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
             ((long)(this->partitions_).
                    super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->partitions_).
                   super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38);
  lVar14 = 8;
  uVar13 = 0;
  while( true ) {
    pPVar4 = this->data_->problemGraph;
    pEVar5 = (pPVar4->graph_).edges_.
             super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pPVar4->graph_).edges_.
                      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar5 >> 4) <= uVar13)
    break;
    lVar6 = *(long *)((long)pEVar5->vertexIndices_ + lVar14 + -8);
    lVar12 = *(long *)((long)pEVar5->vertexIndices_ + lVar14);
    lVar11 = (long)(pPVar4->problem_->nodes).
                   super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar1 = *(uint *)(lVar11 + lVar12 * 0x18);
    uVar2 = *(uint *)(lVar11 + lVar6 * 0x18);
    if (uVar2 != uVar1) {
      lVar11 = lVar6;
      if (uVar2 <= uVar1) {
        lVar11 = lVar12;
        lVar12 = lVar6;
      }
      puVar3 = (this->vertexLabels_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar10 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
                         (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                          puVar3[lVar12],puVar3[lVar11]);
      updateEdgeCost(this,sVar10,
                     -(this->data_->costs).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar13]);
    }
    uVar13 = uVar13 + 1;
    lVar14 = lVar14 + 0x10;
  }
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->branchingLabels_,
             (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,false);
  p_Var9 = &(this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar7 = (p_Var9->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar8 = (p_Var9->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar8;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar7;
  components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)components.labels_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1(__first,__last,(bool *)&components);
  return;
}

Assistant:

PartitionGraph(Data& data, ELABELS& edgeLabels)
      : data_(data)
    {
        size_t numberOfComponents{ 0 };

        { // construct vertex labels.

            struct SubgraphWithCut
            { // a subgraph with cut mask
                SubgraphWithCut(const ELABELS& labels,
                                const ProblemGraph& problemGraph)
                  : labels_(labels)
                  , problemGraph_(problemGraph)
                {
                }
                bool vertex(const std::size_t v) const { return true; }
                bool edge(const std::size_t e) const
                {
                    if (labels_[e] == 1)
                        return false;

                    const auto v0 = problemGraph_.graph().vertexOfEdge(e, 0);
                    const auto v1 = problemGraph_.graph().vertexOfEdge(e, 1);
                    if (problemGraph_.frameOfNode(v0) !=
                        problemGraph_.frameOfNode(v1))
                        return false;
                    return true;
                }

                const ELABELS& labels_;
                const ProblemGraph& problemGraph_;
            };

            // build decomposition based on the current multicut
            andres::graph::ComponentsBySearch<decltype(
                this->data_.problemGraph.graph())>
                components;
            numberOfComponents = components.build(
                this->data_.problemGraph.graph(),
                SubgraphWithCut(edgeLabels, this->data_.problemGraph));

            vertexLabels_ = components.labels_;
        }

        // construct partitions from initial labeling.
        partitions_.resize(numberOfComponents);
        for (size_t v = 0; v < vertexLabels_.size(); ++v) {
            partitions_[vertexLabels_[v]].insert(v);
        }

        // construct vertices and edges of branching graph.
        this->insertVertices(partitions_.size());

        for (size_t edge = 0; edge < data_.problemGraph.graph().numberOfEdges();
             ++edge) {
            auto v0 = data_.problemGraph.graph().vertexOfEdge(edge, 0);
            auto v1 = data_.problemGraph.graph().vertexOfEdge(edge, 1);

            const auto f0 = data_.problemGraph.frameOfNode(v0);
            const auto f1 = data_.problemGraph.frameOfNode(v1);

            // skip in-frame edges.
            if (f0 == f1) {
                continue;
            }

            if (f0 > f1) {
                std::swap(v0, v1);
            }

            const auto branchingEdgeId =
                this->insertEdge(vertexLabels_[v0], vertexLabels_[v1]);
            updateEdgeCost(branchingEdgeId,
                           -data_.costs[edge]); // negative costs because
                                                // BranchingOptimizer
                                                // *maximizes*
        }

        // initialize with empty branching.
        branchingLabels_.resize(this->numberOfEdges(), false);
        std::fill(branchingLabels_.begin(), branchingLabels_.end(), false);

#ifdef DEBUG
        std::cout << "Constructed partitionGraph:" << std::endl;
        std::cout << "  " << this->numberOfVertices() << " vertices"
                  << std::endl;
        std::cout << "  " << this->numberOfEdges() << " edges" << std::endl;
        std::cout << "  " << this->data_.problemGraph.graph().numberOfEdges()
                  << " original edges." << std::endl;
#endif
    }